

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O1

bool __thiscall psy::C::Parser::parseAlignmentSpecifier_AtFirst(Parser *this,SpecifierSyntax **spec)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  AlignmentSpecifierSyntax *pAVar3;
  IndexType IVar4;
  ostream *poVar5;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ == KeywordAlias___alignas) {
    pAVar3 = makeNode<psy::C::AlignmentSpecifierSyntax>(this);
    *spec = &pAVar3->super_SpecifierSyntax;
    IVar4 = consume(this);
    pAVar3->alignasKwTkIdx_ = IVar4;
    bVar1 = parseParenthesizedTypeNameOrExpression(this,&pAVar3->tyRef_);
    return bVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
             ,100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x596);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"assert failure: `_Alignas\'",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return false;
}

Assistant:

bool Parser::parseAlignmentSpecifier_AtFirst(SpecifierSyntax*& spec)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword__Alignas,
                  return false,
                  "assert failure: `_Alignas'");

    auto alignSpec = makeNode<AlignmentSpecifierSyntax>();
    spec = alignSpec;
    alignSpec->alignasKwTkIdx_ = consume();
    return parseParenthesizedTypeNameOrExpression(alignSpec->tyRef_);
}